

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3ExprCodeExprList(Parse *pParse,ExprList *pList,int target,int srcReg,u8 flags)

{
  Vdbe *p;
  Expr *p_00;
  byte bVar1;
  int iVar2;
  Op *pOVar3;
  uint p1;
  uint target_00;
  byte bVar4;
  int iVar5;
  int iVar6;
  anon_union_4_2_6146edf4_for_u *paVar7;
  
  bVar1 = flags & 1 ^ 0x51;
  p = pParse->pVdbe;
  iVar5 = pList->nExpr;
  bVar4 = flags & 0xfd;
  if (pParse->okConstFactor != '\0') {
    bVar4 = flags;
  }
  p1 = (uint)bVar1;
  paVar7 = &pList->a[0].u;
  iVar6 = 0;
  do {
    if (iVar5 <= iVar6) {
      return p1;
    }
    p_00 = ((ExprList_item *)(paVar7 + -5))->pExpr;
    if (((bVar4 & 4) == 0) || ((paVar7->x).iOrderByCol == 0)) {
      if (((bVar4 & 2) == 0) || (iVar2 = sqlite3ExprIsConstantNotJoin(p_00), iVar2 == 0)) {
        target_00 = iVar6 + target;
        p1 = sqlite3ExprCodeTarget(pParse,p_00,target_00);
        if (p1 != target_00) {
          if ((flags & 1) != 0) {
            pOVar3 = (Op *)&sqlite3VdbeGetOp_dummy;
            if (p->db->mallocFailed == '\0') {
              pOVar3 = p->aOp + (long)p->nOp + -1;
            }
            if ((((pOVar3->opcode == 'P') && (iVar2 = pOVar3->p3 + 1, pOVar3->p1 + iVar2 == p1)) &&
                (pOVar3->p2 + iVar2 == target_00)) && (pOVar3->p5 == 0)) {
              pOVar3->p3 = iVar2;
              goto LAB_00195f3e;
            }
          }
LAB_00195f31:
          p1 = sqlite3VdbeAddOp2(p,(uint)bVar1,p1,iVar6 + target);
        }
      }
      else {
        p1 = sqlite3ExprCodeRunJustOnce(pParse,p_00,iVar6 + target);
      }
    }
    else {
      if ((bVar4 & 8) == 0) {
        p1 = (uint)(paVar7->x).iOrderByCol + srcReg + -1;
        goto LAB_00195f31;
      }
      iVar6 = iVar6 + -1;
      iVar5 = iVar5 + -1;
    }
LAB_00195f3e:
    iVar6 = iVar6 + 1;
    paVar7 = paVar7 + 6;
  } while( true );
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprCodeExprList(
  Parse *pParse,     /* Parsing context */
  ExprList *pList,   /* The expression list to be coded */
  int target,        /* Where to write results */
  int srcReg,        /* Source registers if SQLITE_ECEL_REF */
  u8 flags           /* SQLITE_ECEL_* flags */
){
  struct ExprList_item *pItem;
  int i, j, n;
  u8 copyOp = (flags & SQLITE_ECEL_DUP) ? OP_Copy : OP_SCopy;
  Vdbe *v = pParse->pVdbe;
  assert( pList!=0 );
  assert( target>0 );
  assert( pParse->pVdbe!=0 );  /* Never gets this far otherwise */
  n = pList->nExpr;
  if( !ConstFactorOk(pParse) ) flags &= ~SQLITE_ECEL_FACTOR;
  for(pItem=pList->a, i=0; i<n; i++, pItem++){
    Expr *pExpr = pItem->pExpr;
#ifdef SQLITE_ENABLE_SORTER_REFERENCES
    if( pItem->fg.bSorterRef ){
      i--;
      n--;
    }else
#endif
    if( (flags & SQLITE_ECEL_REF)!=0 && (j = pItem->u.x.iOrderByCol)>0 ){
      if( flags & SQLITE_ECEL_OMITREF ){
        i--;
        n--;
      }else{
        sqlite3VdbeAddOp2(v, copyOp, j+srcReg-1, target+i);
      }
    }else if( (flags & SQLITE_ECEL_FACTOR)!=0
           && sqlite3ExprIsConstantNotJoin(pExpr)
    ){
      sqlite3ExprCodeRunJustOnce(pParse, pExpr, target+i);
    }else{
      int inReg = sqlite3ExprCodeTarget(pParse, pExpr, target+i);
      if( inReg!=target+i ){
        VdbeOp *pOp;
        if( copyOp==OP_Copy
         && (pOp=sqlite3VdbeGetLastOp(v))->opcode==OP_Copy
         && pOp->p1+pOp->p3+1==inReg
         && pOp->p2+pOp->p3+1==target+i
         && pOp->p5==0  /* The do-not-merge flag must be clear */
        ){
          pOp->p3++;
        }else{
          sqlite3VdbeAddOp2(v, copyOp, inReg, target+i);
        }
      }
    }
  }
  return n;
}